

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  uint uVar3;
  opj_tcd_tile_t *poVar4;
  opj_tcd_tilecomp_t *poVar5;
  opj_tcd_resolution_t *poVar6;
  opj_tcd_precinct_t *poVar7;
  opj_tcd_cblk_enc_t *poVar8;
  opj_tcd_pass_t *poVar9;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  OPJ_UINT32 OVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  OPJ_UINT32 OVar19;
  ulong uVar20;
  ulong uVar21;
  opj_tcd_layer_t *poVar22;
  OPJ_FLOAT64 *pOVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  OPJ_BYTE *pOVar27;
  uint uVar28;
  double dVar29;
  OPJ_FLOAT64 OVar30;
  ulong local_a0;
  
  poVar4 = tcd->tcd_image->tiles;
  poVar4->distolayer[layno] = 0.0;
  uVar2 = poVar4->numcomps;
  if ((ulong)uVar2 != 0) {
    poVar5 = poVar4->comps;
    uVar17 = 0;
    do {
      uVar20 = (ulong)poVar5[uVar17].numresolutions;
      if (uVar20 != 0) {
        poVar6 = poVar5[uVar17].resolutions;
        uVar16 = 0;
        do {
          uVar3 = poVar6[uVar16].numbands;
          if ((ulong)uVar3 != 0) {
            uVar21 = (ulong)(poVar6[uVar16].ph * poVar6[uVar16].pw);
            local_a0 = 0;
            do {
              if (uVar21 != 0) {
                poVar7 = poVar6[uVar16].bands[local_a0].precincts;
                uVar15 = 0;
                do {
                  uVar12 = poVar7[uVar15].ch * poVar7[uVar15].cw;
                  if (uVar12 != 0) {
                    uVar25 = 0;
                    do {
                      poVar8 = poVar7[uVar15].cblks.enc;
                      poVar1 = poVar8 + uVar25;
                      if (layno == 0) {
                        poVar1->numpassesinlayers = 0;
                        uVar14 = 0;
                      }
                      else {
                        uVar14 = (ulong)poVar1->numpassesinlayers;
                      }
                      poVar22 = poVar8[uVar25].layers + layno;
                      uVar28 = (uint)uVar14;
                      if (uVar28 < poVar1->totalpasses) {
                        poVar9 = poVar1->passes;
                        pOVar23 = &poVar9[uVar14].distortiondec;
                        uVar26 = uVar14;
                        do {
                          uVar18 = ((opj_tcd_pass_t *)(pOVar23 + -1))->rate;
                          if ((int)uVar14 == 0) {
                            dVar29 = (double)*pOVar23;
                          }
                          else {
                            uVar24 = (int)uVar14 - 1;
                            uVar18 = uVar18 - poVar9[uVar24].rate;
                            dVar29 = (double)*pOVar23 - (double)poVar9[uVar24].distortiondec;
                          }
                          if (uVar18 == 0) {
                            bVar10 = dVar29 != 0.0;
                          }
                          else {
                            bVar10 = (double)thresh - dVar29 / (double)uVar18 <
                                     2.220446049250313e-16;
                          }
                          uVar26 = uVar26 + 1;
                          uVar11 = uVar26 & 0xffffffff;
                          if (!bVar10) {
                            uVar11 = uVar14;
                          }
                          uVar14 = uVar11;
                          pOVar23 = pOVar23 + 3;
                          OVar19 = (OPJ_UINT32)uVar14;
                        } while (poVar1->totalpasses != uVar26);
                        poVar22->numpasses = OVar19 - uVar28;
                        if (OVar19 - uVar28 == 0) goto LAB_00125164;
                        uVar18 = OVar19 - 1;
                        poVar9 = poVar1->passes;
                        OVar13 = poVar9[uVar18].rate;
                        if (uVar28 == 0) {
                          pOVar27 = poVar1->data;
                          OVar30 = poVar9[uVar18].distortiondec;
                        }
                        else {
                          OVar13 = OVar13 - poVar9[uVar28 - 1].rate;
                          pOVar27 = poVar1->data + poVar9[uVar28 - 1].rate;
                          OVar30 = (OPJ_FLOAT64)
                                   ((double)poVar9[uVar18].distortiondec -
                                   (double)poVar9[uVar28 - 1].distortiondec);
                        }
                        poVar22->len = OVar13;
                        poVar22->data = pOVar27;
                        poVar22->disto = OVar30;
                        poVar4->distolayer[layno] =
                             (OPJ_FLOAT64)((double)OVar30 + (double)poVar4->distolayer[layno]);
                        if (final != 0) {
                          poVar1->numpassesinlayers = OVar19;
                        }
                      }
                      else {
                        poVar22->numpasses = 0;
LAB_00125164:
                        poVar22->disto = 0.0;
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar12);
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar21);
              }
              local_a0 = local_a0 + 1;
            } while (local_a0 != uVar3);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar20);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar2);
  }
  return;
}

Assistant:

void opj_tcd_makelayer( opj_tcd_t *tcd,
                                                OPJ_UINT32 layno,
                                                OPJ_FLOAT64 thresh,
                                                OPJ_UINT32 final)
{
        OPJ_UINT32 compno, resno, bandno, precno, cblkno;
        OPJ_UINT32 passno;

        opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;

        tcd_tile->distolayer[layno] = 0;        /* fixed_quality */

        for (compno = 0; compno < tcd_tile->numcomps; compno++) {
                opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

                for (resno = 0; resno < tilec->numresolutions; resno++) {
                        opj_tcd_resolution_t *res = &tilec->resolutions[resno];

                        for (bandno = 0; bandno < res->numbands; bandno++) {
                                opj_tcd_band_t *band = &res->bands[bandno];

                                for (precno = 0; precno < res->pw * res->ph; precno++) {
                                        opj_tcd_precinct_t *prc = &band->precincts[precno];

                                        for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                                                opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                                                opj_tcd_layer_t *layer = &cblk->layers[layno];
                                                OPJ_UINT32 n;

                                                if (layno == 0) {
                                                        cblk->numpassesinlayers = 0;
                                                }

                                                n = cblk->numpassesinlayers;

                                                for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                                        OPJ_UINT32 dr;
                                                        OPJ_FLOAT64 dd;
                                                        opj_tcd_pass_t *pass = &cblk->passes[passno];

                                                        if (n == 0) {
                                                                dr = pass->rate;
                                                                dd = pass->distortiondec;
                                                        } else {
                                                                dr = pass->rate - cblk->passes[n - 1].rate;
                                                                dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                                        }

                                                        if (!dr) {
                                                                if (dd != 0)
                                                                        n = passno + 1;
                                                                continue;
                                                        }
                                                        if (thresh - (dd / dr) < DBL_EPSILON) /* do not rely on float equality, check with DBL_EPSILON margin */
                                                                n = passno + 1;
                                                }

                                                layer->numpasses = n - cblk->numpassesinlayers;

                                                if (!layer->numpasses) {
                                                        layer->disto = 0;
                                                        continue;
                                                }

                                                if (cblk->numpassesinlayers == 0) {
                                                        layer->len = cblk->passes[n - 1].rate;
                                                        layer->data = cblk->data;
                                                        layer->disto = cblk->passes[n - 1].distortiondec;
                                                } else {
                                                        layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers - 1].rate;
                                                        layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                                                        layer->disto = cblk->passes[n - 1].distortiondec - cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                                                }

                                                tcd_tile->distolayer[layno] += layer->disto;    /* fixed_quality */

                                                if (final)
                                                        cblk->numpassesinlayers = n;
                                        }
                                }
                        }
                }
        }
}